

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::pm_cmd(int cid,char **args,int argc)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  clientinfo *ci_00;
  clientinfo *ci_01;
  char *pcVar5;
  stringformatter local_260;
  char local_258 [8];
  string senderpmconf;
  char local_148 [8];
  string recieverpmmsg;
  char *privatemessage;
  clientinfo *self;
  clientinfo *ci;
  int cn;
  int argc_local;
  char **args_local;
  int cid_local;
  
  if (args[1] != (char *)0x0) {
    pcVar3 = QServ::getFullText(&qs);
    sVar4 = strlen(pcVar3);
    if (sVar4 != 0) {
      iVar1 = atoi(args[1]);
      ci_00 = QServ::getClient(&qs,iVar1);
      pcVar3 = QServ::getFullText(&qs);
      sVar4 = strlen(pcVar3);
      if (sVar4 == 0) {
        return;
      }
      iVar2 = QServ::getSender(&qs);
      if (iVar1 == iVar2) {
        return;
      }
      if (ci_00 == (clientinfo *)0x0) {
        return;
      }
      if (iVar1 < 0) {
        return;
      }
      if (0x80 < iVar1) {
        return;
      }
      if (args[1] == (char *)0x0) {
        return;
      }
      iVar2 = QServ::getSender(&qs);
      ci_01 = QServ::getClient(&qs,iVar2);
      pcVar3 = QServ::getFullText(&qs);
      sVar4 = strlen(pcVar3);
      if (sVar4 == 0) {
        return;
      }
      if ((ci_00->connected & 1U) == 0) {
        return;
      }
      if (args[1] == (char *)0x0) {
        return;
      }
      if (ci_00 == (clientinfo *)0x0) {
        return;
      }
      pcVar3 = QServ::getFullText(&qs);
      stringformatter::stringformatter((stringformatter *)(senderpmconf + 0x100),local_148);
      pcVar5 = colorname(ci_01);
      stringformatter::operator()
                ((stringformatter *)(senderpmconf + 0x100),"\f7Private message from \f0%s\f7:\f3%s",
                 pcVar5,pcVar3 + 1);
      sendf(iVar1,1,"ris",0x23,local_148);
      stringformatter::stringformatter(&local_260,local_258);
      pcVar5 = colorname(ci_00);
      stringformatter::operator()
                (&local_260,"\f7Sent \f0%s \f7your message:\f3%s",pcVar5,pcVar3 + 1);
      iVar1 = QServ::getSender(&qs);
      sendf(iVar1,1,"ris",0x23,local_258);
      return;
    }
  }
  iVar1 = QServ::getSender(&qs);
  pcVar3 = QServ::getCommandDesc(&qs,cid);
  sendf(iVar1,1,"ris",0x23,pcVar3);
  return;
}

Assistant:

QSERV_CALLBACK pm_cmd(p) {
        int cn = -1;
        if(args[1] != NULL && strlen(fulltext) > 0) {
            cn = atoi(args[1]);
            clientinfo *ci = qs.getClient(cn);
            if(strlen(fulltext) > 0 && cn!=CMD_SENDER && ci != NULL && cn >= 0 && cn <= 128 && args[1] != NULL) {
                clientinfo *self = qs.getClient(CMD_SENDER);
                if(strlen(fulltext) > 0 && ci->connected && args[1] != NULL && ci != NULL) {
                    char* privatemessage = fulltext + 1; //ommit cn from fulltext
                    defformatstring(recieverpmmsg)("\f7Private message from \f0%s\f7:\f3%s", colorname(self), privatemessage);
                    sendf(cn, 1, "ris", N_SERVMSG, recieverpmmsg);
                    defformatstring(senderpmconf)("\f7Sent \f0%s \f7your message:\f3%s", colorname(ci), privatemessage);
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, senderpmconf);
                }
            }
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }